

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Node * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
::CloneFromOther(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
                 *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
                       *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  NodeBase *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  const_iterator __begin0;
  
  internal::UntypedMapBase::begin(&__begin0.super_UntypedMapIterator,(UntypedMapBase *)other);
  pNVar3 = (Node *)0x0;
  while (pNVar1 = __begin0.super_UntypedMapIterator.node_,
        __begin0.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (__begin0.super_UntypedMapIterator.node_ + 1);
    pNVar2 = (Node *)internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
    Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string_const&>
              (&(pNVar2->kv).first,
               (this->
               super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).super_UntypedMapBase.arena_,args);
    (pNVar2->kv).second = *(Proto2MapEnum *)&pNVar1[5].next;
    (pNVar2->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar3;
    internal::UntypedMapIterator::PlusPlus(&__begin0.super_UntypedMapIterator);
    pNVar3 = pNVar2;
  }
  return pNVar3;
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }